

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

void prvTidyDowngradeTypography(TidyDocImpl *doc,Node *node)

{
  uint uVar1;
  byte bVar2;
  Lexer *pLVar3;
  Node *pNVar4;
  Bool BVar5;
  uint uVar6;
  tmbstr ptVar7;
  int iVar8;
  ulong uVar9;
  tmbstr buf;
  uint c;
  uint local_3c;
  TidyDocImpl *local_38;
  
  if (node != (Node *)0x0) {
    pLVar3 = doc->lexer;
    local_38 = doc;
    do {
      pNVar4 = node->next;
      BVar5 = prvTidynodeIsText(node);
      if (BVar5 != no) {
        ptVar7 = pLVar3->lexbuf;
        uVar9 = (ulong)node->start;
        buf = ptVar7 + uVar9;
        if (node->start < node->end) {
          do {
            iVar8 = (int)uVar9;
            bVar2 = pLVar3->lexbuf[uVar9];
            local_3c = (uint)bVar2;
            if ((char)bVar2 < '\0') {
              uVar6 = prvTidyGetUTF8(pLVar3->lexbuf + uVar9,&local_3c);
              iVar8 = iVar8 + uVar6;
            }
            uVar1 = local_3c - 0x2013;
            if ((uVar1 < 0xc) && (uVar1 < 0xc)) {
              if ((0xe0U >> (uVar1 & 0x1f) & 1) == 0) {
                if ((0xe00U >> (uVar1 & 0x1f) & 1) == 0) {
                  if ((3U >> (uVar1 & 0x1f) & 1) != 0) {
                    local_3c = 0x2d;
                  }
                }
                else {
                  local_3c = 0x22;
                }
              }
              else {
                local_3c = 0x27;
              }
            }
            buf = prvTidyPutUTF8(buf,local_3c);
            uVar9 = (ulong)(iVar8 + 1U);
          } while (iVar8 + 1U < node->end);
          ptVar7 = pLVar3->lexbuf;
        }
        node->end = (int)buf - (int)ptVar7;
      }
      if (node->content != (Node *)0x0) {
        prvTidyDowngradeTypography(local_38,node->content);
      }
      node = pNVar4;
    } while (pNVar4 != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(DowngradeTypography)(TidyDocImpl* doc, Node* node)
{
    Node* next;
    Lexer* lexer = doc->lexer;

    while (node)
    {
        next = node->next;

        if (TY_(nodeIsText)(node))
        {
            uint i, c;
            tmbstr p = lexer->lexbuf + node->start;

            for (i = node->start; i < node->end; ++i)
            {
                c = (unsigned char) lexer->lexbuf[i];

                if (c > 0x7F)
                    i += TY_(GetUTF8)(lexer->lexbuf + i, &c);

                if (c >= 0x2013 && c <= 0x201E)
                {
                    switch (c)
                    {
                    case 0x2013: /* en dash */
                    case 0x2014: /* em dash */
                        c = '-';
                        break;
                    case 0x2018: /* left single  quotation mark */
                    case 0x2019: /* right single quotation mark */
                    case 0x201A: /* single low-9 quotation mark */
                        c = '\'';
                        break;
                    case 0x201C: /* left double  quotation mark */
                    case 0x201D: /* right double quotation mark */
                    case 0x201E: /* double low-9 quotation mark */
                        c = '"';
                        break;
                    }
                }

                p = TY_(PutUTF8)(p, c);
            }

            node->end = p - lexer->lexbuf;
        }

        if (node->content)
            TY_(DowngradeTypography)(doc, node->content);

        node = next;
    }
}